

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuUpdate.c
# Opt level: O0

int Fxu_UpdatePairCompare(Fxu_Pair **ppP1,Fxu_Pair **ppP2)

{
  int local_40;
  int local_3c;
  int iP2CubeMin;
  int iP1CubeMin;
  Fxu_Cube *pC2;
  Fxu_Cube *pC1;
  Fxu_Pair **ppP2_local;
  Fxu_Pair **ppP1_local;
  
  if ((*ppP1)->pCube1->pVar->iVar < (*ppP2)->pCube1->pVar->iVar) {
    ppP1_local._4_4_ = -1;
  }
  else if ((*ppP2)->pCube1->pVar->iVar < (*ppP1)->pCube1->pVar->iVar) {
    ppP1_local._4_4_ = 1;
  }
  else {
    if ((*ppP1)->iCube1 < (*ppP1)->iCube2) {
      local_3c = (*ppP1)->iCube1;
    }
    else {
      local_3c = (*ppP1)->iCube2;
    }
    if ((*ppP2)->iCube1 < (*ppP2)->iCube2) {
      local_40 = (*ppP2)->iCube1;
    }
    else {
      local_40 = (*ppP2)->iCube2;
    }
    if (local_3c < local_40) {
      ppP1_local._4_4_ = -1;
    }
    else {
      if (local_3c <= local_40) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuUpdate.c"
                      ,0x26e,"int Fxu_UpdatePairCompare(Fxu_Pair **, Fxu_Pair **)");
      }
      ppP1_local._4_4_ = 1;
    }
  }
  return ppP1_local._4_4_;
}

Assistant:

int Fxu_UpdatePairCompare( Fxu_Pair ** ppP1, Fxu_Pair ** ppP2 )
{
    Fxu_Cube * pC1 = (*ppP1)->pCube1;
    Fxu_Cube * pC2 = (*ppP2)->pCube1;
    int iP1CubeMin, iP2CubeMin;
    if ( pC1->pVar->iVar < pC2->pVar->iVar )
        return -1;
    if ( pC1->pVar->iVar > pC2->pVar->iVar )
        return 1;
    iP1CubeMin = Fxu_PairMinCubeInt( *ppP1 );
    iP2CubeMin = Fxu_PairMinCubeInt( *ppP2 );
    if ( iP1CubeMin < iP2CubeMin )
        return -1;
    if ( iP1CubeMin > iP2CubeMin )
        return 1;
    assert( 0 );
    return 0;
}